

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<int>(BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *this,int *key,JavascriptString **value)

{
  uint uVar1;
  
  uVar1 = FindEntryWithKey<int>(this,key);
  if (-1 < (int)uVar1) {
    *value = (this->entries).ptr[uVar1].
             super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::JavascriptString>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::JavascriptString>_>.
             super_ValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::JavascriptString>_>_>
             .
             super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::JavascriptString>_>
             .value.ptr;
  }
  return -1 < (int)uVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }